

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

int Abs_GiaCheckTruth(word *pTruth,int nSize,int nSize0)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar6 = 1;
  uVar2 = 1 << ((char)nSize - 3U & 0x1f);
  if (nSize < 3) {
    uVar2 = 1;
  }
  uVar7 = (ulong)uVar2;
  if ((nSize0 < 1) || (nSize < nSize0)) {
    __assert_fail("nSize0 > 0 && nSize0 <= nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x27a,"int Abs_GiaCheckTruth(word *, int, int)");
  }
  if (nSize0 == 1) {
    if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        if ((~(*(byte *)((long)pTruth + uVar5) >> 1 ^ *(byte *)((long)pTruth + uVar5)) & 0x55) != 0)
        {
          return 0;
        }
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
  }
  else if (nSize0 == 2) {
    if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        bVar1 = *(byte *)((long)pTruth + uVar5);
        if (((((~bVar1 & 0xf0) == 0) || ((bVar1 & 0xf) == 0xf)) || (bVar1 < 0x10)) ||
           ((bVar1 & 0xf) == 0)) {
          return 0;
        }
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
  }
  else {
    iVar4 = nSize0 + -3;
    uVar6 = 1 << ((byte)iVar4 & 0x1f);
    if ((int)uVar2 < 1) {
      lVar3 = 0;
    }
    else {
      uVar5 = 1;
      if (1 < (int)uVar6) {
        uVar5 = (ulong)uVar6;
      }
      lVar3 = 0;
      do {
        uVar9 = 0;
        if (iVar4 != 0x1f) {
          uVar8 = 0;
          do {
            uVar9 = uVar8;
            if (*(char *)((long)pTruth + uVar8) != '\0') break;
            uVar8 = uVar8 + 1;
            uVar9 = uVar5;
          } while (uVar5 != uVar8);
        }
        if ((uint)uVar9 == uVar6) break;
        uVar9 = 0;
        if (iVar4 != 0x1f) {
          uVar8 = 0;
          do {
            uVar9 = uVar8;
            if (*(char *)((long)pTruth + uVar8) != -1) break;
            uVar8 = uVar8 + 1;
            uVar9 = uVar5;
          } while (uVar5 != uVar8);
        }
        if ((uint)uVar9 == uVar6) break;
        lVar3 = lVar3 + (int)uVar6;
        pTruth = (word *)((long)pTruth + (long)(int)uVar6);
      } while (lVar3 < (long)uVar7);
    }
    uVar6 = (uint)lVar3;
    if (uVar6 != uVar2 && (int)uVar2 <= (int)uVar6) {
      __assert_fail("i <= nStr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                    ,0x299,"int Abs_GiaCheckTruth(word *, int, int)");
    }
    uVar6 = (uint)(uVar6 == uVar2);
  }
  return uVar6;
}

Assistant:

int Abs_GiaCheckTruth( word * pTruth, int nSize, int nSize0 )
{
    unsigned char * pStr = (unsigned char *)pTruth;
    int nStr = (nSize >= 3 ? (1 << (nSize - 3)) : 1);
    int i, k, nSteps;
    assert( nSize0 > 0 && nSize0 <= nSize );
    if ( nSize0 == 1 )
    {
        for ( i = 0; i < nStr; i++ )
            if ( (((unsigned)pStr[i] ^ ((unsigned)pStr[i] >> 1)) & 0x55) != 0x55 )
                return 0;
        return 1;
    }
    if ( nSize0 == 2 )
    {
        for ( i = 0; i < nStr; i++ )
            if ( ((unsigned)pStr[i] & 0xF) == 0x0 || (((unsigned)pStr[i] >> 4) & 0xF) == 0x0 || 
                 ((unsigned)pStr[i] & 0xF) == 0xF || (((unsigned)pStr[i] >> 4) & 0xF) == 0xF  )
                return 0;
        return 1;
    }
    assert( nSize0 >= 3 );
    nSteps = (1 << (nSize0 - 3));
    for ( i = 0; i < nStr; i += nSteps )
    {
        for ( k = 0; k < nSteps; k++ )
            if ( ((unsigned)pStr[i+k] & 0xFF) != 0x00 )
                break;
        if ( k == nSteps )
            break;
        for ( k = 0; k < nSteps; k++ )
            if ( ((unsigned)pStr[i+k] & 0xFF) != 0xFF )
                break;
        if ( k == nSteps )
            break;
    }
    assert( i <= nStr );
    return (int)( i == nStr );
}